

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,true,false>
               (string_t *ldata,interval_t *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  anon_struct_16_3_d7536bce_for_pointer aVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  interval_t iVar11;
  interval_t date;
  interval_t date_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      aVar2 = (ldata->value).pointer;
      lVar6 = 8;
      do {
        iVar11.micros = *(int64_t *)((long)&rdata->months + lVar6);
        iVar11._0_8_ = *(undefined8 *)((long)rdata + lVar6 + -8);
        iVar11 = DateTruncBinaryOperator::
                 Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                           ((string_t)aVar2,iVar11);
        *(long *)((long)result_data + lVar6 + -8) = iVar11._0_8_;
        *(int64_t *)((long)&result_data->months + lVar6) = iVar11.micros;
        lVar6 = lVar6 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    uVar8 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar3 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar3 = count;
        }
LAB_0062c1ac:
        uVar10 = uVar8;
        if (uVar8 < uVar3) {
          aVar2 = (ldata->value).pointer;
          uVar5 = uVar8 << 4 | 8;
          do {
            date.micros = *(int64_t *)((long)&rdata->months + uVar5);
            date._0_8_ = *(undefined8 *)((long)rdata + (uVar5 - 8));
            iVar11 = DateTruncBinaryOperator::
                     Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                               ((string_t)aVar2,date);
            *(long *)((long)result_data + (uVar5 - 8)) = iVar11._0_8_;
            *(int64_t *)((long)&result_data->months + uVar5) = iVar11.micros;
            uVar8 = uVar8 + 1;
            uVar5 = uVar5 + 0x10;
            uVar10 = uVar3;
          } while (uVar3 != uVar8);
        }
      }
      else {
        uVar5 = puVar1[uVar4];
        uVar3 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar3 = count;
        }
        uVar10 = uVar3;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) goto LAB_0062c1ac;
          uVar10 = uVar8;
          if (uVar8 < uVar3) {
            uVar9 = uVar8 << 4 | 8;
            uVar7 = 0;
            do {
              if ((uVar5 >> (uVar7 & 0x3f) & 1) != 0) {
                date_00.micros = *(int64_t *)((long)&rdata->months + uVar9);
                date_00._0_8_ = *(undefined8 *)((long)rdata + (uVar9 - 8));
                iVar11 = DateTruncBinaryOperator::
                         Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                                   ((string_t)(ldata->value).pointer,date_00);
                *(long *)((long)result_data + (uVar9 - 8)) = iVar11._0_8_;
                *(int64_t *)((long)&result_data->months + uVar9) = iVar11.micros;
              }
              uVar7 = uVar7 + 1;
              uVar9 = uVar9 + 0x10;
              uVar10 = uVar3;
            } while (uVar3 - uVar8 != uVar7);
          }
        }
      }
      uVar4 = uVar4 + 1;
      uVar8 = uVar10;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}